

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codacheck.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  char cVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined8 uVar6;
  int local_420;
  char c2;
  int k;
  char c;
  char filename [1000];
  char *definition_path;
  undefined4 local_20;
  int i;
  int option_use_mmap;
  int option_stdin;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  option_verbose = 0;
  option_quick = 0;
  local_20 = 1;
  option_require_definition = 0;
  if (((argc == 1) || (iVar4 = strcmp(argv[1],"-h"), iVar4 == 0)) ||
     (iVar4 = strcmp(argv[1],"--help"), iVar4 == 0)) {
    print_help();
    exit(0);
  }
  iVar4 = strcmp(argv[1],"-v");
  if ((iVar4 == 0) || (iVar4 = strcmp(argv[1],"--version"), iVar4 == 0)) {
    print_version();
    exit(0);
  }
  definition_path._4_4_ = 1;
  if ((argc < 3) || (iVar4 = strcmp(argv[1],"-D"), iVar4 != 0)) {
    filename._992_8_ = anon_var_dwarf_85;
    iVar4 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
    pFVar2 = _stderr;
    if (iVar4 != 0) {
      puVar5 = (undefined4 *)coda_get_errno();
      uVar6 = coda_errno_to_string(*puVar5);
      fprintf(pFVar2,"ERROR: %s\n",uVar6);
      exit(1);
    }
  }
  else {
    coda_set_definition_path(argv[2]);
    definition_path._4_4_ = 3;
  }
  do {
    if (argc <= definition_path._4_4_) {
LAB_001015bf:
      iVar4 = coda_init();
      pFVar2 = _stderr;
      if (iVar4 != 0) {
        puVar5 = (undefined4 *)coda_get_errno();
        uVar6 = coda_errno_to_string(*puVar5);
        fprintf(pFVar2,"ERROR: %s\n",uVar6);
        exit(1);
      }
      coda_set_option_perform_boundary_checks(0);
      coda_set_option_perform_conversions(0);
      coda_set_option_use_mmap(local_20);
      if (bVar1) {
        do {
          local_420 = 0;
          while( true ) {
            iVar4 = getchar();
            cVar3 = (char)iVar4;
            if (cVar3 == '\r') {
              iVar4 = getchar();
              if ((char)iVar4 != '\n') {
                ungetc((int)(char)iVar4,_stdin);
              }
            }
            if (((cVar3 == -1) || (cVar3 == '\n')) || (cVar3 == '\r')) break;
            *(char *)((long)&k + (long)local_420) = cVar3;
            local_420 = local_420 + 1;
            if (999 < local_420) {
              __assert_fail("k < 1000",
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codacheck/codacheck.c"
                            ,0x139,"int main(int, char **)");
            }
          }
          *(undefined1 *)((long)&k + (long)local_420) = 0;
          if (0 < local_420) {
            check_file((char *)&k);
            fflush((FILE *)0x0);
          }
        } while (cVar3 != -1);
      }
      else {
        for (; definition_path._4_4_ < argc; definition_path._4_4_ = definition_path._4_4_ + 1) {
          check_file(argv[definition_path._4_4_]);
          fflush((FILE *)0x0);
        }
      }
      coda_done();
      if (found_errors == 0) {
        return 0;
      }
      exit(1);
    }
    iVar4 = strcmp(argv[definition_path._4_4_],"-V");
    if ((iVar4 == 0) || (iVar4 = strcmp(argv[definition_path._4_4_],"--verbose"), iVar4 == 0)) {
      option_verbose = 1;
    }
    else {
      iVar4 = strcmp(argv[definition_path._4_4_],"-q");
      if ((iVar4 == 0) || (iVar4 = strcmp(argv[definition_path._4_4_],"--quick"), iVar4 == 0)) {
        option_quick = 1;
      }
      else {
        iVar4 = strcmp(argv[definition_path._4_4_],"-d");
        if ((iVar4 == 0) || (iVar4 = strcmp(argv[definition_path._4_4_],"--definition"), iVar4 == 0)
           ) {
          option_require_definition = 1;
        }
        else {
          iVar4 = strcmp(argv[definition_path._4_4_],"--no-mmap");
          if (iVar4 != 0) {
            iVar4 = strcmp(argv[definition_path._4_4_],"-");
            if ((iVar4 == 0) && (definition_path._4_4_ == argc + -1)) {
              bVar1 = true;
            }
            else if (*argv[definition_path._4_4_] == '-') {
              fprintf(_stderr,"ERROR: invalid arguments\n");
              print_help();
              exit(1);
            }
            goto LAB_001015bf;
          }
          local_20 = 0;
        }
      }
    }
    definition_path._4_4_ = definition_path._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    int option_stdin;
    int option_use_mmap;
    int i;

    option_stdin = 0;
    option_verbose = 0;
    option_quick = 0;
    option_use_mmap = 1;
    option_require_definition = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbose") == 0)
        {
            option_verbose = 1;
        }
        else if (strcmp(argv[i], "-q") == 0 || strcmp(argv[i], "--quick") == 0)
        {
            option_quick = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--definition") == 0)
        {
            option_require_definition = 1;
        }
        else if (strcmp(argv[i], "--no-mmap") == 0)
        {
            option_use_mmap = 0;
        }
        else if (strcmp(argv[i], "-") == 0 && i == argc - 1)
        {
            option_stdin = 1;
            break;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    /* The codacheck program should never navigate beyond the array bounds.
     * We therefore disable to boundary check option to increase performance.
     * Mind that this option does not influence the out-of-bounds check that CODA performs to ensure
     * that a read is performed using a byte offset/size that is within the limits of the total file size.
     */
    coda_set_option_perform_boundary_checks(0);

    /* We disable conversions since this speeds up the check of reading all numerical data */
    coda_set_option_perform_conversions(0);

    /* Set mmap based on the chosen option */
    coda_set_option_use_mmap(option_use_mmap);

    if (option_stdin)
    {
        char filename[1000];
        char c;

        do
        {
            int k;

            k = 0;
            for (;;)
            {
                c = getchar();
                if (c == '\r')
                {
                    char c2;

                    c2 = getchar();
                    /* test for '\r\n' combination */
                    if (c2 != '\n')
                    {
                        /* if the second char is not '\n' put it back in the read buffer */
                        ungetc(c2, stdin);
                    }
                }
                if (c == EOF || c == '\n' || c == '\r')
                {
                    filename[k] = '\0';
                    break;
                }
                filename[k] = c;
                k++;
                assert(k < 1000);
            }
            if (k > 0)
            {
                check_file(filename);
                fflush(NULL);
            }
        } while (c != EOF);
    }
    else
    {
        while (i < argc)
        {
            check_file(argv[i]);
            fflush(NULL);
            i++;
        }
    }

    coda_done();

    if (found_errors)
    {
        exit(1);
    }

    return 0;
}